

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O0

lzma_ret lzma_decoder_init(lzma_lz_decoder_conflict1 *lz,lzma_allocator *allocator,void *options,
                          lzma_lz_options *lz_options)

{
  _Bool _Var1;
  lzma_ret ret_;
  lzma_lz_options *lz_options_local;
  void *options_local;
  lzma_allocator *allocator_local;
  lzma_lz_decoder_conflict1 *lz_local;
  
  _Var1 = is_lclppb_valid((lzma_options_lzma *)options);
  if (_Var1) {
    lz_local._4_4_ = lzma_lzma_decoder_create(lz,allocator,options,lz_options);
    if (lz_local._4_4_ == LZMA_OK) {
      lzma_decoder_reset(lz->coder,options);
      lzma_decoder_uncompressed(lz->coder,0xffffffffffffffff);
      lz_local._4_4_ = LZMA_OK;
    }
  }
  else {
    lz_local._4_4_ = LZMA_PROG_ERROR;
  }
  return lz_local._4_4_;
}

Assistant:

static lzma_ret
lzma_decoder_init(lzma_lz_decoder *lz, lzma_allocator *allocator,
		const void *options, lzma_lz_options *lz_options)
{
	if (!is_lclppb_valid(options))
		return LZMA_PROG_ERROR;

	return_if_error(lzma_lzma_decoder_create(
			lz, allocator, options, lz_options));

	lzma_decoder_reset(lz->coder, options);
	lzma_decoder_uncompressed(lz->coder, LZMA_VLI_UNKNOWN);

	return LZMA_OK;
}